

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::extractClassName(string *__return_storage_ptr__,string *classOrQualifiedMethodName)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (classOrQualifiedMethodName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + classOrQualifiedMethodName->_M_string_length);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"&","");
  uVar3 = local_68;
  uVar2 = __return_storage_ptr__->_M_string_length;
  if ((uVar2 < local_68) ||
     (std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__),
     local_48 != local_68)) {
    bVar6 = false;
  }
  else if (local_48 == 0) {
    bVar6 = true;
  }
  else {
    iVar4 = bcmp(local_50,local_70,local_48);
    bVar6 = iVar4 == 0;
  }
  if ((uVar3 <= uVar2) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (bVar6) {
    lVar5 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x144850,0xffffffffffffffff);
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x144850,lVar5 - 1);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( startsWith( className, "&" ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }